

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  int local_34;
  char c;
  char *pcStack_30;
  int charCount;
  char *wordPtr;
  char *wordString;
  char *pcStack_18;
  uint word;
  char *str_local;
  Instruction *this_local;
  
  local_34 = 0;
  pcStack_30 = (char *)((long)&wordString + 4);
  pcStack_18 = str;
  str_local = (char *)this;
  do {
    cVar1 = *pcStack_18;
    pcStack_18 = pcStack_18 + 1;
    *pcStack_30 = cVar1;
    local_34 = local_34 + 1;
    pcStack_30 = pcStack_30 + 1;
    if (local_34 == 4) {
      addImmediateOperand(this,wordString._4_4_);
      local_34 = 0;
      pcStack_30 = (char *)((long)&wordString + 4);
    }
  } while (cVar1 != '\0');
  if (0 < local_34) {
    for (; local_34 < 4; local_34 = local_34 + 1) {
      *pcStack_30 = '\0';
      pcStack_30 = pcStack_30 + 1;
    }
    addImmediateOperand(this,wordString._4_4_);
  }
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word;
        char* wordString = (char*)&word;
        char* wordPtr = wordString;
        int charCount = 0;
        char c;
        do {
            c = *(str++);
            *(wordPtr++) = c;
            ++charCount;
            if (charCount == 4) {
                addImmediateOperand(word);
                wordPtr = wordString;
                charCount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (charCount > 0) {
            // pad with 0s
            for (; charCount < 4; ++charCount)
                *(wordPtr++) = 0;
            addImmediateOperand(word);
        }
    }